

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void * lua_topointer(lua_State *L,int idx)

{
  TValue *o;
  GCObject *pGVar1;
  void *pvVar2;
  byte bVar3;
  
  o = index2value(L,idx);
  bVar3 = o->tt_ & 0x3f;
  if ((bVar3 != 2) && (bVar3 != 7)) {
    if ((bVar3 == 0x16) || ((o->tt_ & 0x40) != 0)) {
      pGVar1 = (o->value_).gc;
    }
    else {
      pGVar1 = (GCObject *)0x0;
    }
    return pGVar1;
  }
  pvVar2 = touserdata(o);
  return pvVar2;
}

Assistant:

LUA_API const void *lua_topointer (lua_State *L, int idx) {
  const TValue *o = index2value(L, idx);
  switch (ttypetag(o)) {
    case LUA_VLCF: return cast_voidp(cast_sizet(fvalue(o)));
    case LUA_VUSERDATA: case LUA_VLIGHTUSERDATA:
      return touserdata(o);
    default: {
      if (iscollectable(o))
        return gcvalue(o);
      else
        return NULL;
    }
  }
}